

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O0

bool Memory::StandAloneFreeListPolicy::TryEnsureFreeListEntry(StandAloneFreeListPolicy **_this)

{
  StandAloneFreeListPolicy *policy;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint *puVar5;
  StandAloneFreeListPolicy *pSVar6;
  uint sizeInBytes;
  StandAloneFreeListPolicy *newThis;
  uint entries;
  StandAloneFreeListPolicy *oldThis;
  StandAloneFreeListPolicy **_this_local;
  
  if ((*_this)->freeList == 0) {
    if ((*_this)->used < (*_this)->allocated) {
      (*_this)->used = (*_this)->used + 1;
      (*_this)->freeList = (*_this)->used;
    }
    else {
      if ((*_this)->used != (*_this)->allocated) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                           ,0x3dc,"(_this->used == _this->allocated)",
                           "_this->used == _this->allocated");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      policy = *_this;
      uVar3 = policy->allocated;
      puVar5 = min<unsigned_int>(&policy->allocated,&MaxEntriesGrowth);
      pSVar6 = NewInternal(uVar3 + *puVar5);
      if (pSVar6 == (StandAloneFreeListPolicy *)0x0) {
        return false;
      }
      js_memcpy_s(pSVar6->freeObjectLists,0x100,policy->freeObjectLists,0x100);
      js_memcpy_s(pSVar6->entries,(ulong)pSVar6->allocated << 4,policy->entries,
                  (ulong)policy->used << 4);
      pSVar6->used = policy->used + 1;
      pSVar6->freeList = pSVar6->used;
      *_this = pSVar6;
      uVar3 = GetPlusSize(policy);
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::StandAloneFreeListPolicy>
                (&HeapAllocator::Instance,policy,(ulong)uVar3);
    }
  }
  return true;
}

Assistant:

bool StandAloneFreeListPolicy::TryEnsureFreeListEntry(StandAloneFreeListPolicy *& _this)
{
    if (0 == _this->freeList)
    {
        if (_this->used < _this->allocated)
        {
            _this->used++;
            _this->freeList = _this->used;
        }
        else
        {
            Assert(_this->used == _this->allocated);

            StandAloneFreeListPolicy * oldThis = _this;
            uint entries = oldThis->allocated + min(oldThis->allocated, MaxEntriesGrowth);
            StandAloneFreeListPolicy * newThis = NewInternal(entries);
            if (NULL != newThis)
            {
                uint sizeInBytes = buckets * sizeof(uint);
                js_memcpy_s(newThis->freeObjectLists, sizeInBytes, oldThis->freeObjectLists, sizeInBytes);
                js_memcpy_s(newThis->entries, newThis->allocated * sizeof(FreeObjectListEntry), oldThis->entries, oldThis->used * sizeof(FreeObjectListEntry));
                newThis->used = oldThis->used + 1;
                newThis->freeList = newThis->used;
                _this = newThis;
                HeapDeletePlus(GetPlusSize(oldThis), oldThis);
            }
            else
            {
                return false;
            }
        }
    }

    return true;
}